

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

bool Imath_3_2::checkForZeroScaleInRow<float>(float *scl,Vec3<float> *row,bool exc)

{
  float *pfVar1;
  domain_error *this;
  byte in_DL;
  Vec3<float> *in_RSI;
  float *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  int local_20;
  
  local_20 = 0;
  do {
    if (2 < local_20) {
      return true;
    }
    fVar2 = abs<float>(*in_RDI);
    if (fVar2 < 1.0) {
      pfVar1 = Vec3<float>::operator[](in_RSI,local_20);
      fVar2 = abs<float>(*pfVar1);
      fVar3 = std::numeric_limits<float>::max();
      fVar4 = abs<float>(*in_RDI);
      if (fVar3 * fVar4 <= fVar2) {
        if ((in_DL & 1) == 0) {
          return false;
        }
        this = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error(this,"Cannot remove zero scaling from matrix.");
        __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool
checkForZeroScaleInRow (const T& scl, const Vec3<T>& row, bool exc /* = true */)
{
    for (int i = 0; i < 3; i++)
    {
        if ((abs (scl) < 1 &&
             abs (row[i]) >= std::numeric_limits<T>::max () * abs (scl)))
        {
            if (exc)
                throw std::domain_error ("Cannot remove zero scaling "
                                         "from matrix.");
            else
                return false;
        }
    }

    return true;
}